

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

wostream * Centaurus::operator<<(wostream *os,IndexVector *v)

{
  pointer piVar1;
  pointer piVar2;
  uint uVar3;
  wostream *pwVar4;
  
  std::operator<<(os,L'[');
  uVar3 = 0;
  while( true ) {
    piVar1 = (v->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    piVar2 = (v->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (((long)piVar1 - (long)piVar2 >> 2) - 1U <= (ulong)uVar3) break;
    pwVar4 = (wostream *)std::wostream::operator<<((wostream *)os,piVar2[uVar3]);
    std::operator<<(pwVar4,L',');
    uVar3 = uVar3 + 1;
  }
  if (piVar2 != piVar1) {
    std::wostream::operator<<((wostream *)os,piVar1[-1]);
  }
  std::operator<<(os,L']');
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const IndexVector& v)
{
    os << L'[';
    for (unsigned int i = 0; i < v.size() - 1; i++)
    {
        os << v[i] << L',';
    }
    if (!v.empty())
        os << v.back();
    os << L']';
    return os;
}